

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

string * __thiscall
pbrt::FilmBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,FilmBase *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<int>const&,float_const&,pbrt::FilterHandle_const&,std::__cxx11::string_const&,pbrt::Bounds2<int>const&>
            (__return_storage_ptr__,
             "fullResolution: %s diagonal: %f filter: %s filename: %s pixelBounds: %s",
             &this->fullResolution,&this->diagonal,&this->filter,&this->filename,&this->pixelBounds)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string FilmBase::BaseToString() const {
    return StringPrintf("fullResolution: %s diagonal: %f filter: %s filename: %s "
                        "pixelBounds: %s",
                        fullResolution, diagonal, filter, filename, pixelBounds);
}